

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_convex_poly.cpp
# Opt level: O3

bool __thiscall ON_3dSimplex::Closest1plex(ON_3dSimplex *this,ON_4dPoint *Bary)

{
  double dVar1;
  double dVar2;
  double yy;
  ON_3dVector Del;
  ON_4dPoint local_50;
  ON_3dVector local_30;
  
  ON_3dVector::operator-(&local_30,this->m_V + 1,this->m_V);
  dVar1 = ON_3dVector::LengthSquared(&local_30);
  if (0.0 < dVar1) {
    ON_3dVector::operator-((ON_3dVector *)&local_50,this->m_V);
    dVar2 = ON_3dVector::operator*((ON_3dVector *)&local_50,&local_30);
    if (dVar1 <= dVar2) {
      yy = 1.0;
      dVar2 = 0.0;
    }
    else if (dVar2 <= 0.0) {
      dVar2 = 1.0;
      yy = 0.0;
    }
    else {
      yy = dVar2 / dVar1 + -1.0 + 1.0;
      dVar2 = 1.0 - yy;
    }
    ON_4dPoint::ON_4dPoint(&local_50,dVar2,yy,0.0,0.0);
    Bary->z = local_50.z;
    Bary->w = local_50.w;
    Bary->x = local_50.x;
    Bary->y = local_50.y;
  }
  return 0.0 < dVar1;
}

Assistant:

bool ON_3dSimplex::Closest1plex(ON_4dPoint& Bary) const
{
  bool rc = false;
  ON_3dVector Del = m_V[1] - m_V[0];
  double Del2 = Del.LengthSquared();
  if (Del2 > 0.0)
  {
    rc = true;
    double dot = -m_V[0] * Del;
    if (dot >= Del2)
      Bary = ON_4dPoint(0, 1, 0, 0);
    else if (dot <= 0)
      Bary = ON_4dPoint(1, 0, 0, 0);
    else
    {
      double b0 = dot / Del2;
      b0 = 1 - (1 - b0);      // ensure b0 + ( 1- b0) == 1.0 without rounding 
      Bary = ON_4dPoint(1 - b0, b0, 0, 0);
    }
  }
  return rc;
}